

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O3

bool __thiscall
cmTargetLinkLibrariesCommand::HandleLibrary
          (cmTargetLinkLibrariesCommand *this,string *lib,cmTargetLinkLibraryType llt)

{
  cmTarget *pcVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  PolicyStatus PVar4;
  ostream *poVar5;
  size_t sVar6;
  cmake *this_00;
  size_type sVar7;
  long *plVar8;
  size_type *psVar9;
  PolicyID id;
  uint uVar10;
  pointer pbVar11;
  char *pcVar12;
  char *pcVar13;
  MessageType t;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugConfigs;
  string prop;
  string local_1f0;
  undefined4 local_1cc;
  undefined1 local_1c8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178 [4];
  ios_base local_138 [264];
  
  pcVar1 = this->Target;
  if (this->CurrentProcessingState != ProcessingKeywordLinkInterface &&
      pcVar1->TargetTypeValue == INTERFACE_LIBRARY) {
    pcVar2 = (this->super_cmCommand).Makefile;
    local_1a8._M_allocated_capacity = (size_type)&local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1a8,
               "INTERFACE library can only be used with the INTERFACE keyword of target_link_libraries"
               ,"");
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&local_1a8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_allocated_capacity == &local_198) {
      return false;
    }
    operator_delete((void *)local_1a8._M_allocated_capacity,
                    CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) + 1);
    return false;
  }
  uVar10 = this->CurrentProcessingState - ProcessingKeywordLinkInterface;
  cmMakefile::GetExecutionContext((cmListFileContext *)&local_1a8,(this->super_cmCommand).Makefile);
  bVar3 = cmTarget::PushTLLCommandTrace(pcVar1,(uint)(4 < uVar10),(cmListFileContext *)&local_1a8);
  if (local_188 != local_178) {
    operator_delete(local_188,local_178[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_allocated_capacity != &local_198) {
    operator_delete((void *)local_1a8._M_allocated_capacity,
                    CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) + 1);
  }
  if (bVar3) goto LAB_003eb473;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8._M_local_buf);
  PVar4 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0023);
  if (PVar4 - NEW < 3) {
    t = FATAL_ERROR;
    local_1cc = (undefined4)CONCAT71((uint7)(uint3)(PVar4 >> 8),1);
    pcVar13 = "must";
LAB_003eb30d:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"The ",4);
    pcVar12 = "keyword";
    if (4 >= uVar10) {
      pcVar12 = "plain";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,pcVar12,(ulong)(4 < uVar10) * 2 + 5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               " signature for target_link_libraries has already been used with the target \"",0x4c)
    ;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1a8,(this->Target->Name)._M_dataplus._M_p,
                        (this->Target->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"\".  All uses of target_link_libraries with a target ",0x34);
    sVar6 = strlen(pcVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar13,sVar6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5," be either all-keyword or all-plain.\n",0x25);
    cmTarget::GetTllSignatureTraces
              (this->Target,(ostringstream *)local_1a8._M_local_buf,(uint)(uVar10 < 5));
    pcVar2 = (this->super_cmCommand).Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar2,t,&local_1f0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if ((char)local_1cc != '\0') {
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8._M_local_buf);
      std::ios_base::~ios_base(local_138);
      return false;
    }
  }
  else if (PVar4 == WARN) {
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1f0,(cmPolicies *)0x17,id);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1a8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    local_1cc = 0;
    pcVar13 = "should";
    t = AUTHOR_WARNING;
    goto LAB_003eb30d;
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8._M_local_buf);
  std::ios_base::~ios_base(local_138);
LAB_003eb473:
  if (1 < this->CurrentProcessingState - ProcessingPlainLinkInterface) {
    cmMakefile::AddLinkLibraryForTarget
              ((this->super_cmCommand).Makefile,&this->Target->Name,lib,llt);
    if (1 < this->CurrentProcessingState - ProcessingPlainPublicInterface) {
      if (this->CurrentProcessingState == ProcessingLinkLibraries) {
        pcVar1 = this->Target;
        local_1a8._M_allocated_capacity = (size_type)&local_198;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1a8,"INTERFACE_LINK_LIBRARIES","");
        cmTarget::GetDebugGeneratorExpressions(&local_1f0,this->Target,lib,llt);
        cmTarget::AppendProperty(pcVar1,(string *)&local_1a8,local_1f0._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_allocated_capacity != &local_198) {
          operator_delete((void *)local_1a8._M_allocated_capacity,
                          CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0])
                          + 1);
        }
        return true;
      }
      if (this->Target->TargetTypeValue != STATIC_LIBRARY) {
        return true;
      }
      cmTarget::GetDebugGeneratorExpressions((string *)&local_1a8,this->Target,lib,llt);
      bVar3 = cmGeneratorExpression::IsValidTargetName(lib);
      if ((bVar3) || (sVar7 = cmGeneratorExpression::Find(lib), sVar7 != 0xffffffffffffffff)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1c8,"$<LINK_ONLY:",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1a8);
        plVar8 = (long *)std::__cxx11::string::append(local_1c8);
        psVar9 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_1f0.field_2._M_allocated_capacity = *psVar9;
          local_1f0.field_2._8_8_ = plVar8[3];
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        }
        else {
          local_1f0.field_2._M_allocated_capacity = *psVar9;
          local_1f0._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_1f0._M_string_length = plVar8[1];
        *plVar8 = (long)psVar9;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_1a8._M_local_buf,(string *)&local_1f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_1c8._0_8_ != (pointer)(local_1c8 + 0x10)) {
          operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
        }
      }
      pcVar1 = this->Target;
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f0,"INTERFACE_LINK_LIBRARIES","");
      cmTarget::AppendProperty(pcVar1,&local_1f0,(char *)local_1a8._M_allocated_capacity,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_allocated_capacity != &local_198) {
        operator_delete((void *)local_1a8._M_allocated_capacity,
                        CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) +
                        1);
        return true;
      }
      return true;
    }
  }
  pcVar1 = this->Target;
  local_1a8._M_allocated_capacity = (size_type)&local_198;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a8,"INTERFACE_LINK_LIBRARIES","");
  cmTarget::GetDebugGeneratorExpressions(&local_1f0,this->Target,lib,llt);
  cmTarget::AppendProperty(pcVar1,(string *)&local_1a8,local_1f0._M_dataplus._M_p,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_allocated_capacity != &local_198) {
    operator_delete((void *)local_1a8._M_allocated_capacity,
                    CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) + 1);
  }
  PVar4 = cmPolicies::PolicyMap::Get(&this->Target->PolicyMap,CMP0022);
  if ((PVar4 < NEW) && (this->Target->TargetTypeValue != INTERFACE_LIBRARY)) {
    this_00 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
    cmake::GetDebugConfigs_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1c8,this_00);
    local_1a8._M_allocated_capacity = (size_type)&local_198;
    local_1a8._8_8_ = (char *)0x0;
    local_198._M_local_buf[0] = '\0';
    if ((llt < OPTIMIZED_LibraryType) && (local_1c8._0_8_ != local_1c8._8_8_)) {
      pbVar11 = (pointer)local_1c8._0_8_;
      do {
        std::__cxx11::string::_M_replace((ulong)&local_1a8,0,(char *)local_1a8._8_8_,0x5c4ca6);
        std::__cxx11::string::_M_append(local_1a8._M_local_buf,(ulong)(pbVar11->_M_dataplus)._M_p);
        cmTarget::AppendProperty(this->Target,(string *)&local_1a8,(lib->_M_dataplus)._M_p,false);
        pbVar11 = pbVar11 + 1;
      } while (pbVar11 != (pointer)local_1c8._8_8_);
    }
    if ((llt & ~OPTIMIZED_LibraryType) == GENERAL_LibraryType) {
      pcVar1 = this->Target;
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f0,"LINK_INTERFACE_LIBRARIES","");
      cmTarget::AppendProperty(pcVar1,&local_1f0,(lib->_M_dataplus)._M_p,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      if (local_1c8._0_8_ != local_1c8._8_8_) {
        pbVar11 = (pointer)local_1c8._0_8_;
        do {
          std::__cxx11::string::_M_replace((ulong)&local_1a8,0,(char *)local_1a8._8_8_,0x5c4ca6);
          std::__cxx11::string::_M_append(local_1a8._M_local_buf,(ulong)(pbVar11->_M_dataplus)._M_p)
          ;
          pcVar13 = cmTarget::GetProperty(this->Target,(string *)&local_1a8);
          if (pcVar13 == (char *)0x0) {
            cmTarget::SetProperty(this->Target,(string *)&local_1a8,"");
          }
          pbVar11 = pbVar11 + 1;
        } while (pbVar11 != (pointer)local_1c8._8_8_);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_allocated_capacity != &local_198) {
      operator_delete((void *)local_1a8._M_allocated_capacity,
                      CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) + 1)
      ;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1c8);
  }
  return true;
}

Assistant:

bool
cmTargetLinkLibrariesCommand::HandleLibrary(const std::string& lib,
                                            cmTargetLinkLibraryType llt)
{
  if(this->Target->GetType() == cmState::INTERFACE_LIBRARY
      && this->CurrentProcessingState != ProcessingKeywordLinkInterface)
    {
    this->Makefile->IssueMessage(cmake::FATAL_ERROR,
      "INTERFACE library can only be used with the INTERFACE keyword of "
      "target_link_libraries");
    return false;
    }

  cmTarget::TLLSignature sig =
        (this->CurrentProcessingState == ProcessingPlainPrivateInterface
      || this->CurrentProcessingState == ProcessingPlainPublicInterface
      || this->CurrentProcessingState == ProcessingKeywordPrivateInterface
      || this->CurrentProcessingState == ProcessingKeywordPublicInterface
      || this->CurrentProcessingState == ProcessingKeywordLinkInterface)
        ? cmTarget::KeywordTLLSignature : cmTarget::PlainTLLSignature;
  if (!this->Target->PushTLLCommandTrace(
        sig, this->Makefile->GetExecutionContext()))
    {
    std::ostringstream e;
    const char *modal = 0;
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    switch(this->Makefile->GetPolicyStatus(cmPolicies::CMP0023))
      {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0023) << "\n";
        modal = "should";
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        modal = "must";
        messageType = cmake::FATAL_ERROR;
      }

      if(modal)
        {
        // If the sig is a keyword form and there is a conflict, the existing
        // form must be the plain form.
        const char *existingSig
                    = (sig == cmTarget::KeywordTLLSignature ? "plain"
                                                            : "keyword");
          e <<
            "The " << existingSig << " signature for target_link_libraries "
            "has already been used with the target \""
          << this->Target->GetName() << "\".  All uses of "
             "target_link_libraries with a target " << modal << " be either "
             "all-keyword or all-plain.\n";
        this->Target->GetTllSignatureTraces(e,
                                          sig == cmTarget::KeywordTLLSignature
                                            ? cmTarget::PlainTLLSignature
                                            : cmTarget::KeywordTLLSignature);
        this->Makefile->IssueMessage(messageType, e.str());
        if(messageType == cmake::FATAL_ERROR)
          {
          return false;
          }
        }
    }

  // Handle normal case first.
  if(this->CurrentProcessingState != ProcessingKeywordLinkInterface
      && this->CurrentProcessingState != ProcessingPlainLinkInterface)
    {
    this->Makefile
      ->AddLinkLibraryForTarget(this->Target->GetName(), lib, llt);
    if(this->CurrentProcessingState == ProcessingLinkLibraries)
      {
      this->Target->AppendProperty("INTERFACE_LINK_LIBRARIES",
        this->Target->GetDebugGeneratorExpressions(lib, llt).c_str());
      return true;
      }
    else if(this->CurrentProcessingState != ProcessingKeywordPublicInterface
            && this->CurrentProcessingState != ProcessingPlainPublicInterface)
      {
      if (this->Target->GetType() == cmState::STATIC_LIBRARY)
        {
        std::string configLib = this->Target
                                     ->GetDebugGeneratorExpressions(lib, llt);
        if (cmGeneratorExpression::IsValidTargetName(lib)
            || cmGeneratorExpression::Find(lib) != std::string::npos)
          {
          configLib = "$<LINK_ONLY:" + configLib + ">";
          }
        this->Target->AppendProperty("INTERFACE_LINK_LIBRARIES",
                                     configLib.c_str());
        }
      // Not a 'public' or 'interface' library. Do not add to interface
      // property.
      return true;
      }
    }

  this->Target->AppendProperty("INTERFACE_LINK_LIBRARIES",
              this->Target->GetDebugGeneratorExpressions(lib, llt).c_str());

  const cmPolicies::PolicyStatus policy22Status
                      = this->Target->GetPolicyStatusCMP0022();

  if (policy22Status != cmPolicies::OLD
      && policy22Status != cmPolicies::WARN)
    {
    return true;
    }

  if (this->Target->GetType() == cmState::INTERFACE_LIBRARY)
    {
    return true;
    }

  // Get the list of configurations considered to be DEBUG.
  std::vector<std::string> debugConfigs =
    this->Makefile->GetCMakeInstance()->GetDebugConfigs();
  std::string prop;

  // Include this library in the link interface for the target.
  if(llt == DEBUG_LibraryType || llt == GENERAL_LibraryType)
    {
    // Put in the DEBUG configuration interfaces.
    for(std::vector<std::string>::const_iterator i = debugConfigs.begin();
        i != debugConfigs.end(); ++i)
      {
      prop = "LINK_INTERFACE_LIBRARIES_";
      prop += *i;
      this->Target->AppendProperty(prop, lib.c_str());
      }
    }
  if(llt == OPTIMIZED_LibraryType || llt == GENERAL_LibraryType)
    {
    // Put in the non-DEBUG configuration interfaces.
    this->Target->AppendProperty("LINK_INTERFACE_LIBRARIES", lib.c_str());

    // Make sure the DEBUG configuration interfaces exist so that the
    // general one will not be used as a fall-back.
    for(std::vector<std::string>::const_iterator i = debugConfigs.begin();
        i != debugConfigs.end(); ++i)
      {
      prop = "LINK_INTERFACE_LIBRARIES_";
      prop += *i;
      if(!this->Target->GetProperty(prop))
        {
        this->Target->SetProperty(prop, "");
        }
      }
    }
  return true;
}